

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_tls12_prf_input(psa_tls12_prf_key_derivation_t *prf,psa_algorithm_t hash_alg,
                   psa_key_derivation_step_t step,uint8_t *data,size_t data_length)

{
  size_t data_length_local;
  uint8_t *data_local;
  psa_key_derivation_step_t step_local;
  psa_algorithm_t hash_alg_local;
  psa_tls12_prf_key_derivation_t *prf_local;
  
  if (step == 0x101) {
    prf_local._4_4_ = psa_tls12_prf_set_key(prf,hash_alg,data,data_length);
  }
  else if (step == 0x201) {
    prf_local._4_4_ = psa_tls12_prf_set_label(prf,data,data_length);
  }
  else if (step == 0x204) {
    prf_local._4_4_ = psa_tls12_prf_set_seed(prf,data,data_length);
  }
  else {
    prf_local._4_4_ = -0x87;
  }
  return prf_local._4_4_;
}

Assistant:

static psa_status_t psa_tls12_prf_input( psa_tls12_prf_key_derivation_t *prf,
                                         psa_algorithm_t hash_alg,
                                         psa_key_derivation_step_t step,
                                         const uint8_t *data,
                                         size_t data_length )
{
    switch( step )
    {
        case PSA_KEY_DERIVATION_INPUT_SEED:
            return( psa_tls12_prf_set_seed( prf, data, data_length ) );
        case PSA_KEY_DERIVATION_INPUT_SECRET:
            return( psa_tls12_prf_set_key( prf, hash_alg, data, data_length ) );
        case PSA_KEY_DERIVATION_INPUT_LABEL:
            return( psa_tls12_prf_set_label( prf, data, data_length ) );
        default:
            return( PSA_ERROR_INVALID_ARGUMENT );
    }
}